

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

int __thiscall OpenMD::Stats::getIntError(Stats *this,int index)

{
  reference pvVar1;
  int in_ESI;
  long in_RDI;
  RealType value;
  ResultType *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RDI + 0x18),(long)in_ESI);
  if (pvVar1->accumulator != (BaseAccumulator *)0x0) {
    __dynamic_cast(pvVar1->accumulator,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  }
  Accumulator::get95percentConfidenceInterval
            ((Accumulator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return (int)(double)in_stack_ffffffffffffffe8;
}

Assistant:

int Stats::getIntError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    RealType value;
    dynamic_cast<Accumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return (int)value;
  }